

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O0

vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> * __thiscall
jaegertracing::Span::tags
          (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *__return_storage_ptr__,
          Span *this)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  Span *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)(this + 0x168));
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            (__return_storage_ptr__,
             (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(this + 0x120));
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tag> tags() const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _tags;
    }